

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O3

void __thiscall
graphics101::ShaderProgram::setUniform
          (ShaderProgram *this,string *name,
          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          *value)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  if (this->m_program != 0) {
    (*gl3wProcs.ptr[0x22f])();
    uVar2 = anon_unknown.dwarf_11fe9e::location(this->m_program,name);
    lVar1 = *(long *)value;
    lVar3 = 0;
    if (*(long *)(value + 8) - lVar1 != 0) {
      lVar3 = lVar1;
    }
    (*gl3wProcs.ptr[0x214])
              ((ulong)uVar2,(ulong)(*(long *)(value + 8) - lVar1) >> 4,lVar3,lVar1,
               gl3wProcs.ptr[0x214]);
    return;
  }
  __assert_fail("m_program != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/shaderprogram.cpp"
                ,0xdc,"void graphics101::ShaderProgram::use() const");
}

Assistant:

void ShaderProgram::setUniform( const std::string& name, const std::vector< vec4 >& value ) {
    use();
    bind_uniform( location( m_program, name ), value );
}